

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_settable(lua_State *L,int idx)

{
  TValue *t_00;
  int local_28;
  int hres;
  TValue *t;
  int idx_local;
  lua_State *L_local;
  
  t_00 = index2value(L,idx);
  if (t_00->tt_ == 'E') {
    local_28 = luaH_pset((Table *)(t_00->value_).gc,(TValue *)((L->top).offset + -0x20),
                         (TValue *)((L->top).offset + -0x10));
  }
  else {
    local_28 = 2;
  }
  if (local_28 == 0) {
    if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) &&
        ((((t_00->value_).gc)->marked & 0x20) != 0)) &&
       ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
      luaC_barrierback_(L,(t_00->value_).gc);
    }
  }
  else {
    luaV_finishset(L,t_00,(TValue *)((L->top).offset + -0x20),(TValue *)((L->top).offset + -0x10),
                   local_28);
  }
  (L->top).p = (StkId)((L->top).offset + -0x20);
  return;
}

Assistant:

LUA_API void lua_settable (lua_State *L, int idx) {
  TValue *t;
  int hres;
  lua_lock(L);
  api_checkpop(L, 2);
  t = index2value(L, idx);
  luaV_fastset(t, s2v(L->top.p - 2), s2v(L->top.p - 1), hres, luaH_pset);
  if (hres == HOK)
    luaV_finishfastset(L, t, s2v(L->top.p - 1));
  else
    luaV_finishset(L, t, s2v(L->top.p - 2), s2v(L->top.p - 1), hres);
  L->top.p -= 2;  /* pop index and value */
  lua_unlock(L);
}